

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

char * __thiscall TiXmlElement::Attribute(TiXmlElement *this,char *name,int *i)

{
  int iVar1;
  char *pcVar2;
  TiXmlAttribute *pTVar3;
  
  pTVar3 = &(this->attributeSet).sentinel;
  do {
    pTVar3 = pTVar3->next;
    if (pTVar3 == &(this->attributeSet).sentinel) {
      return (char *)0x0;
    }
    iVar1 = strcmp(((pTVar3->name).rep_)->str,name);
  } while (iVar1 != 0);
  pcVar2 = ((pTVar3->value).rep_)->str;
  if (i != (int *)0x0) {
    __isoc99_sscanf(pcVar2,"%d",i);
  }
  return pcVar2;
}

Assistant:

const char* TiXmlElement::Attribute( const char* name, int* i ) const
{
	const TiXmlAttribute* attrib = attributeSet.Find( name );
	const char* result = 0;

	if ( attrib ) {
		result = attrib->Value();
		if ( i ) {
			attrib->QueryIntValue( i );
		}
	}
	return result;
}